

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::ScrollArea::sizeHint(ScrollArea *this)

{
  int iVar1;
  int iVar2;
  QWidget *pQVar3;
  QSize QVar4;
  QSize local_74;
  QSize local_6c;
  QSize local_64;
  QSize frameSize;
  QSize marginsSize;
  QSize local_4c [2];
  QWidget local_38 [12];
  int local_2c;
  int h;
  QSize sz;
  ScrollAreaPrivate *d;
  ScrollArea *this_local;
  
  sz = (QSize)d_func(this);
  QSize::QSize((QSize *)&stack0xffffffffffffffd8,0,0);
  QWidget::fontMetrics(local_38);
  iVar1 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_38);
  local_2c = iVar1;
  pQVar3 = QPointer::operator_cast_to_QWidget_((QPointer *)((long)sz + 0xa8));
  if (pQVar3 == (QWidget *)0x0) {
    QSize::QSize(&marginsSize,local_2c * 0xc,local_2c << 3);
    QSize::operator+=((QSize *)&stack0xffffffffffffffd8,&marginsSize);
  }
  else {
    if ((*(byte *)((long)sz + 0xb8) & 1) == 0) {
      pQVar3 = QPointer<QWidget>::operator->((QPointer<QWidget> *)((long)sz + 0xa8));
      local_4c[0] = QWidget::size(pQVar3);
    }
    else {
      pQVar3 = QPointer<QWidget>::operator->((QPointer<QWidget> *)((long)sz + 0xa8));
      local_4c[0] = (QSize)(**(code **)(*(long *)pQVar3 + 0x70))();
    }
    QSize::operator+=((QSize *)&stack0xffffffffffffffd8,local_4c);
  }
  QSize::QSize(&frameSize,*(int *)((long)sz + 0x44) + *(int *)((long)sz + 0x40),
               *(int *)((long)sz + 0x38) + *(int *)((long)sz + 0x3c));
  iVar1 = QFrame::frameWidth();
  iVar2 = QFrame::frameWidth();
  QSize::QSize(&local_64,iVar1 << 1,iVar2 << 1);
  local_6c = operator+(&frameSize,&local_64);
  QSize::operator+=((QSize *)&stack0xffffffffffffffd8,&local_6c);
  QSize::QSize(&local_74,local_2c * 0x24,local_2c * 0x18);
  QVar4 = QSize::boundedTo((QSize *)&stack0xffffffffffffffd8,&local_74);
  return QVar4;
}

Assistant:

QSize
ScrollArea::sizeHint() const
{
	const ScrollAreaPrivate * d = d_func();

	QSize sz( 0, 0 );
	const int h = fontMetrics().height();

	if( d->widget )
		sz += ( d->resizable ? d->widget->sizeHint() : d->widget->size() );
	else
		sz += QSize( 12 * h, 8 * h );

	const QSize marginsSize = QSize( d->left + d->right, d->top + d->bottom );
	const QSize frameSize = QSize( frameWidth() * 2, frameWidth() * 2 );

	sz += marginsSize + frameSize;

	return sz.boundedTo( QSize( 36 * h, 24 * h ) );
}